

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestProperty * __thiscall testing::TestResult::GetTestProperty(TestResult *this,int i)

{
  int iVar1;
  const_reference pvVar2;
  int i_local;
  TestResult *this_local;
  
  if (-1 < i) {
    iVar1 = test_property_count(this);
    if (i < iVar1) goto LAB_0014c50a;
  }
  internal::posix::Abort();
LAB_0014c50a:
  pvVar2 = std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::at
                     (&this->test_properties_,(long)i);
  return pvVar2;
}

Assistant:

const TestProperty& TestResult::GetTestProperty(int i) const {
  if (i < 0 || i >= test_property_count())
    internal::posix::Abort();
  return test_properties_.at(i);
}